

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O0

void Abc_ObjChangeUpdate(Abc_Obj_t *pObj,int iFanin,Mio_Cell2_t *pCells,int *pNodeInfo,
                        Vec_Int_t *vTemp)

{
  int iVar1;
  int iVar2;
  int iNodeCell;
  int Perm;
  int v;
  Vec_Int_t *vTemp_local;
  int *pNodeInfo_local;
  Mio_Cell2_t *pCells_local;
  int iFanin_local;
  Abc_Obj_t *pObj_local;
  
  pObj->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)pCells[pNodeInfo[iFanin * 3]].pMioGate;
  iVar1 = pNodeInfo[iFanin * 3 + 1];
  Vec_IntClear(vTemp);
  iNodeCell = 0;
  while( true ) {
    iVar2 = Abc_ObjFaninNum(pObj);
    if (iVar2 <= iNodeCell) break;
    iVar2 = Abc_ObjFaninId(pObj,iVar1 >> ((byte)(iNodeCell << 2) & 0x1f) & 0xf);
    Vec_IntPush(vTemp,iVar2);
    iNodeCell = iNodeCell + 1;
  }
  Vec_IntClear(&pObj->vFanins);
  Vec_IntAppend(&pObj->vFanins,vTemp);
  return;
}

Assistant:

void Abc_ObjChangeUpdate( Abc_Obj_t * pObj, int iFanin, Mio_Cell2_t * pCells, int * pNodeInfo, Vec_Int_t * vTemp )
{
    int v, Perm, iNodeCell = pNodeInfo[3*iFanin];
    //Mio_Gate_t * pGate = (Mio_Gate_t *)pObj->pData;
    //Abc_ObjPrint( stdout, pObj );
    //printf( "Replacing fanout %d with %s by %s with fanin %d.\n", Abc_ObjId(pObj), Mio_GateReadName(pGate), Mio_GateReadName((Mio_Gate_t *)pCells[iNodeCell].pMioGate), iFanin );
    pObj->pData = (Mio_Gate_t *)pCells[iNodeCell].pMioGate;
    Perm = pNodeInfo[3*iFanin+1];
    Vec_IntClear( vTemp );
    for ( v = 0; v < Abc_ObjFaninNum(pObj); v++ )
        Vec_IntPush( vTemp, Abc_ObjFaninId(pObj, (Perm >> (v << 2)) & 15) );
    Vec_IntClear( &pObj->vFanins );
    Vec_IntAppend( &pObj->vFanins, vTemp );
}